

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall higan::HttpServer::OnMessageSendOver(HttpServer *this,TcpConnectionPtr *connection)

{
  bool bVar1;
  element_type *peVar2;
  any *__any;
  shared_ptr<higan::FileContext> *psVar3;
  element_type *this_00;
  allocator<char> local_89;
  string local_88;
  ssize_t local_68;
  ssize_t send_size;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  FileContextPtr file_ptr;
  TcpConnectionPtr *connection_local;
  HttpServer *this_local;
  
  file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)connection;
  peVar2 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"HttpFileContext",&local_49);
  __any = TcpConnection::GetContext(peVar2,&local_48);
  psVar3 = std::any_cast<std::shared_ptr<higan::FileContext>>(__any);
  std::shared_ptr<higan::FileContext>::shared_ptr((shared_ptr<higan::FileContext> *)local_28,psVar3)
  ;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68 = SendFileInternal(this,(TcpConnectionPtr *)
                                   file_ptr.
                                   super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi,(shared_ptr<higan::FileContext> *)local_28);
  if (local_68 < 1) {
    if (local_68 == 0) {
      peVar2 = std::
               __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file_ptr.
                             super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
      TcpConnection::SetCallSendOverCallback(peVar2,false);
      peVar2 = std::
               __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file_ptr.
                             super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"HttpFileContext",&local_89);
      TcpConnection::DeleteContext(peVar2,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      this_00 = std::
                __shared_ptr_access<higan::FileContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<higan::FileContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
      bVar1 = FileContext::CloseConnection(this_00);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)file_ptr.
                                 super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
        TcpConnection::DestroyConnection(peVar2);
      }
    }
    else if (local_68 == -1) {
      peVar2 = std::
               __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file_ptr.
                             super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
      TcpConnection::DestroyConnection(peVar2);
    }
  }
  else {
    peVar2 = std::
             __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)file_ptr.
                           super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
    TcpConnection::SetCallSendOverCallback(peVar2,true);
  }
  std::shared_ptr<higan::FileContext>::~shared_ptr((shared_ptr<higan::FileContext> *)local_28);
  return;
}

Assistant:

void HttpServer::OnMessageSendOver(const TcpConnectionPtr& connection)
{
	/**
	 * 如果存在相关上下文 说明文件未发送完毕 继续发送
	 */
	FileContext::FileContextPtr file_ptr = *std::any_cast<FileContext::FileContextPtr>(
			connection->GetContext("HttpFileContext"));

	ssize_t send_size = SendFileInternal(connection, file_ptr);

	if (send_size > 0)
	{
		connection->SetCallSendOverCallback(true);
	}
	else if (send_size == 0)
	{
		connection->SetCallSendOverCallback(false);
		connection->DeleteContext("HttpFileContext");

		if (file_ptr->CloseConnection())
		{
			connection->DestroyConnection();
		}
	}
	else if (send_size == -1)
	{
		connection->DestroyConnection();
	}
}